

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  Message *message;
  AssertHelper *this_00;
  AssertHelper *this_01;
  value_type pcVar2;
  value_type *file;
  key_type rhs_expression;
  unsigned_long *lhs;
  AssertHelper *this_02;
  long in_RDI;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht;
  AssertionResult gtest_ar;
  size_type old_bucket_count;
  undefined4 in_stack_fffffffffffffc38;
  int in_stack_fffffffffffffc3c;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc40;
  key_equal *in_stack_fffffffffffffc48;
  int iVar3;
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  int line;
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Type TVar4;
  AssertHelper *in_stack_fffffffffffffc70;
  AssertionResult local_300;
  key_type local_2f0;
  value_type local_290;
  value_type *in_stack_fffffffffffffd78;
  value_type *obj;
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd80;
  AssertionResult local_1f8;
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> local_1e8;
  Hasher local_1d8;
  Hasher local_1cc [17];
  size_type local_100;
  AssertionResult local_f8;
  key_type local_e8;
  value_type local_88;
  key_type local_80;
  value_type local_20;
  AssertHelper *local_18;
  key_type local_10;
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffc68 >> 0x20);
  message = (Message *)(in_RDI + 0x10);
  local_10 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffc40,
                    (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_18 = (AssertHelper *)
             google::
             BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0x1004a96);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_20 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_80 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffc40,
          (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_88 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  local_e8 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffc50,(int)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffc40,
          (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_100 = google::
              BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0x1004bb7);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
             (unsigned_long *)in_stack_fffffffffffffc48,(unsigned_long *)in_stack_fffffffffffffc40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc70);
    testing::AssertionResult::failure_message((AssertionResult *)0x1004c1e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc70,TVar4,(char *)in_stack_fffffffffffffc60,
               (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),(char *)in_stack_fffffffffffffc50);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
    testing::Message::~Message((Message *)0x1004c7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1004cec);
  Hasher::Hasher(local_1cc,0);
  Hasher::Hasher(&local_1d8,0);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::Alloc(&local_1e8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58,
             (hasher *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
             (allocator_type *)in_stack_fffffffffffffc40);
  Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_1e8);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                  *)0x1004d6f);
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
             (unsigned_long *)in_stack_fffffffffffffc48,(uint *)in_stack_fffffffffffffc40);
  iVar3 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc70);
    testing::AssertionResult::failure_message((AssertionResult *)0x1004e40);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc70,TVar4,(char *)in_stack_fffffffffffffc60,line,
               (char *)in_stack_fffffffffffffc50);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc40);
    testing::Message::~Message((Message *)0x1004e9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1004f0e);
  HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueKey(in_stack_fffffffffffffc50,iVar3);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffc40,
                    (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0x1004f58);
  local_18 = this_01;
  pcVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  TVar4 = (Type)((ulong)pcVar2 >> 0x20);
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  file = (value_type *)
         HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(in_stack_fffffffffffffc50,iVar3);
  obj = file;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffc40,
          (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  pcVar2 = HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
  local_290 = pcVar2;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffd80,obj);
  rhs_expression =
       HashtableTest<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(in_stack_fffffffffffffc50,iVar3);
  local_2f0 = rhs_expression;
  google::
  BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *)in_stack_fffffffffffffc40,
          (key_type *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  lhs = (unsigned_long *)
        google::
        BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        ::bucket_count((BaseHashtableInterface<google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                        *)0x100507d);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,lhs,(unsigned_long *)in_stack_fffffffffffffc40);
  iVar3 = (int)((ulong)pcVar2 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_300);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_02 = (AssertHelper *)
              testing::AssertionResult::failure_message((AssertionResult *)0x1005104);
    testing::internal::AssertHelper::AssertHelper(this_01,TVar4,(char *)file,iVar3,rhs_expression);
    testing::internal::AssertHelper::operator=(this_00,message);
    testing::internal::AssertHelper::~AssertHelper(this_02);
    testing::Message::~Message((Message *)0x1005161);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10051cc);
  google::
  HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0x10051d9);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}